

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<void> __thiscall
kj::anon_unknown_36::NetworkAddressHttpClient::onDrained(NetworkAddressHttpClient *this)

{
  SourceLocation location;
  long in_RSI;
  PromiseFulfillerPair<void> paf;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> local_48;
  PromiseBase in_stack_ffffffffffffffd0;
  Disposer *in_stack_ffffffffffffffd8;
  PromiseFulfiller<void> *in_stack_ffffffffffffffe0;
  
  location.function = (char *)in_stack_ffffffffffffffd8;
  location.fileName = (char *)in_stack_ffffffffffffffd0.node.ptr;
  location._16_8_ = in_stack_ffffffffffffffe0;
  newPromiseAndFulfiller<void>(location);
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator=
            ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)(in_RSI + 0x58),&local_48);
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::dispose(&local_48);
  (this->super_HttpClient)._vptr_HttpClient = (_func_int **)in_stack_ffffffffffffffd0.node.ptr;
  PromiseFulfillerPair<void>::~PromiseFulfillerPair
            ((PromiseFulfillerPair<void> *)&stack0xffffffffffffffd0);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> onDrained() {
    // Returns a promise which resolves the next time isDrained() transitions from false to true.
    auto paf = kj::newPromiseAndFulfiller<void>();
    drainedFulfiller = kj::mv(paf.fulfiller);
    return kj::mv(paf.promise);
  }